

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O0

Status google::protobuf::(anonymous_namespace)::
       Error<char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*,std::basic_string_view<char,std::char_traits<char>>,char_const*>
                 (char *args,basic_string_view<char,_std::char_traits<char>_> args_1,char *args_2,
                 basic_string_view<char,_std::char_traits<char>_> args_3,char *args_4)

{
  string_view pc;
  string_view pc_00;
  string_view message;
  char *in_stack_00000010;
  AlphaNum local_178;
  char *local_148;
  AlphaNum local_138;
  AlphaNum local_108;
  char *local_d8;
  size_t sStack_d0;
  AlphaNum local_c8;
  AlphaNum local_98;
  string local_68;
  undefined1 local_48 [16];
  char *local_38;
  char *args_local_3;
  char *args_local_2;
  char *args_local;
  basic_string_view<char,_std::char_traits<char>_> args_local_1;
  
  local_38 = args_3._M_str;
  args_local_3 = (char *)args_3._M_len;
  args_local = args_1._M_str;
  args_local_2 = (char *)args_1._M_len;
  args_local_1._M_len = (size_t)args_2;
  args_local_1._M_str = args;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_98,args_local_2);
  local_d8 = args_local;
  sStack_d0 = args_local_1._M_len;
  pc._M_str = (char *)args_local_1._M_len;
  pc._M_len = (size_t)args_local;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_c8,pc);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_108,args_local_3);
  local_148 = args_4;
  pc_00._M_str = in_stack_00000010;
  pc_00._M_len = (size_t)args_4;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_138,pc_00);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_178,local_38);
  absl::lts_20250127::StrCat<>(&local_68,&local_98,&local_c8,&local_108,&local_138,&local_178);
  local_48 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_68);
  message._M_str = local_48._0_8_;
  message._M_len = (size_t)args;
  absl::lts_20250127::FailedPreconditionError(message);
  std::__cxx11::string::~string((string *)&local_68);
  return (Status)(uintptr_t)args;
}

Assistant:

absl::Status Error(Args... args) {
  return absl::FailedPreconditionError(absl::StrCat(args...));
}